

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall
TPZSkylMatrix<double>::Decompose_Cholesky_blk(TPZSkylMatrix<double> *this,int64_t blk_sz)

{
  long lVar1;
  char cVar2;
  double **ppdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  bool bVar13;
  int iVar14;
  undefined4 extraout_var;
  long lVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  ostream *poVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ulong uVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar50;
  undefined1 auVar49 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  long local_a8;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  double local_78;
  long lVar15;
  
  cVar2 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed;
  if (cVar2 != '\0') {
    if (cVar2 == '\x03') {
      return 1;
    }
    TPZMatrix<double>::Error
              ("int TPZSkylMatrix<double>::Decompose_Cholesky_blk(int64_t) [TVar = double]",
               "Decompose_Cholesky <Matrix already Decomposed>");
  }
  iVar14 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
             [0xc])();
  lVar15 = CONCAT44(extraout_var,iVar14);
  local_98 = -8;
  local_a8 = 1;
  lVar23 = 8;
  local_78 = 0.0;
  lVar16 = 0;
  auVar52 = _DAT_014f8340;
  auVar53 = _DAT_014f8350;
  do {
    if (lVar15 <= lVar16) {
      (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x03';
      (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\x01';
      return 1;
    }
    lVar17 = blk_sz + lVar16;
    lVar30 = lVar17;
    if (lVar15 < lVar17) {
      lVar30 = lVar15;
    }
    lVar30 = lVar30 + lVar16;
    local_88 = local_a8;
    local_90 = local_98;
    lVar1 = lVar16;
    local_80 = lVar23;
    do {
      lVar27 = lVar1;
      if ((lVar15 <= lVar27) ||
         (ppdVar3 = (this->fElem).fStore, lVar24 = (long)ppdVar3[lVar27 + 1] - (long)ppdVar3[lVar27]
         , lVar24 == 0)) break;
      lVar24 = lVar24 >> 3;
      lVar1 = lVar27 + 1;
      lVar18 = lVar1 - lVar24;
      if (lVar18 < lVar16) {
        lVar18 = lVar16;
      }
      lVar21 = lVar27;
      if (lVar30 < lVar27) {
        lVar21 = lVar30;
      }
      if (lVar18 < lVar21) {
        ppdVar3 = (this->fElem).fStore;
        pdVar4 = ppdVar3[lVar27];
        pdVar5 = ppdVar3[lVar1];
        lVar24 = local_88 - lVar24;
        if (lVar24 < lVar16) {
          lVar24 = lVar16;
        }
        uVar25 = (ulong)((long)pdVar5 + ((lVar24 * 8 + local_90) - (long)pdVar4)) >> 3;
        lVar24 = local_80 + lVar24 * -8 + (long)pdVar4;
        uVar22 = uVar25 & 0xffffffff;
        iVar14 = 0;
        do {
          pdVar19 = pdVar4 + (lVar27 - lVar18);
          pdVar6 = ppdVar3[lVar18];
          uVar31 = (ulong)((long)ppdVar3[lVar18 + 1] + (-8 - (long)pdVar6)) >> 3;
          uVar29 = (uint)uVar31;
          uVar26 = (uint)((ulong)((long)pdVar5 + (-8 - (long)pdVar19)) >> 3);
          if (uVar29 < uVar26) {
            uVar26 = uVar29;
          }
          if (uVar26 == 0) {
            dVar33 = 0.0;
          }
          else {
            uVar32 = (ulong)(uint)((int)uVar25 + iVar14);
            uVar31 = uVar31 & 0xffffffff;
            if (uVar31 <= uVar32) {
              uVar32 = uVar31;
            }
            lVar28 = uVar32 - 1;
            auVar34._8_4_ = (int)lVar28;
            auVar34._0_8_ = lVar28;
            auVar34._12_4_ = (int)((ulong)lVar28 >> 0x20);
            if (uVar22 < uVar31) {
              uVar31 = uVar22;
            }
            auVar34 = auVar34 ^ auVar53;
            uVar32 = 0;
            dVar33 = 0.0;
            dVar50 = -0.0;
            do {
              dVar12 = dVar50;
              dVar11 = dVar33;
              auVar37._8_4_ = (int)uVar32;
              auVar37._0_8_ = uVar32;
              auVar37._12_4_ = (int)(uVar32 >> 0x20);
              auVar37 = (auVar37 | auVar52) ^ auVar53;
              auVar46._0_4_ = -(uint)(auVar34._0_4_ < auVar37._0_4_);
              auVar46._4_4_ = -(uint)(auVar34._4_4_ < auVar37._4_4_);
              auVar46._8_4_ = -(uint)(auVar34._8_4_ < auVar37._8_4_);
              auVar46._12_4_ = -(uint)(auVar34._12_4_ < auVar37._12_4_);
              auVar38._4_4_ = -(uint)(auVar37._4_4_ == auVar34._4_4_);
              auVar38._12_4_ = -(uint)(auVar37._12_4_ == auVar34._12_4_);
              auVar38._0_4_ = auVar38._4_4_;
              auVar38._8_4_ = auVar38._12_4_;
              auVar39._4_4_ = auVar46._4_4_;
              auVar39._0_4_ = auVar46._4_4_;
              auVar39._8_4_ = auVar46._12_4_;
              auVar39._12_4_ = auVar46._12_4_;
              auVar37 = auVar38 & auVar46 | auVar39;
              dVar33 = dVar11;
              dVar50 = dVar12;
              if ((~auVar37._0_4_ & 1) != 0) {
                dVar33 = *(double *)(lVar24 + uVar32 * 8);
                dVar50 = 0.0;
                in_XMM6._8_8_ = 0;
                in_XMM6._0_8_ = pdVar6[uVar32 + 1];
              }
              if (((auVar37._8_2_ ^ 0xffff) & 1) != 0) {
                dVar50 = *(double *)(lVar24 + 8 + uVar32 * 8);
                in_XMM6._8_8_ = pdVar6[uVar32 + 2];
              }
              dVar33 = dVar33 * in_XMM6._0_8_ + dVar11;
              dVar50 = dVar50 * in_XMM6._8_8_ + dVar12;
              uVar32 = uVar32 + 2;
            } while ((uVar31 + 1 & 0xfffffffffffffffe) != uVar32);
            auVar35._4_4_ = auVar46._0_4_;
            auVar35._0_4_ = auVar46._0_4_;
            auVar35._8_4_ = auVar46._8_4_;
            auVar35._12_4_ = auVar46._8_4_;
            auVar39 = auVar38 & auVar35 | auVar39;
            uVar32 = auVar39._0_8_;
            uVar45 = auVar39._8_8_;
            uVar31 = (ulong)dVar12 & uVar45;
            auVar40._0_8_ = ~uVar32 & (ulong)dVar33;
            auVar40._8_8_ = ~uVar45 & (ulong)dVar50;
            auVar7._8_4_ = (int)uVar31;
            auVar7._0_8_ = (ulong)dVar11 & uVar32;
            auVar7._12_4_ = (int)(uVar31 >> 0x20);
            dVar33 = SUB168(auVar40 | auVar7,8) + SUB168(auVar40 | auVar7,0);
          }
          lVar18 = lVar18 + 1;
          *pdVar19 = (*pdVar19 - dVar33) / local_78;
          iVar14 = iVar14 + 1;
          lVar24 = lVar24 + -8;
          uVar22 = (ulong)((int)uVar22 + 1);
        } while (lVar18 < lVar21);
      }
      bVar13 = true;
      if (lVar27 <= lVar30) {
        ppdVar3 = (this->fElem).fStore;
        pdVar4 = ppdVar3[lVar27];
        pdVar5 = ppdVar3[lVar1];
        local_78 = 0.0;
        if (pdVar4 + 1 < pdVar5) {
          pdVar19 = pdVar4 + 2;
          if (pdVar4 + 2 < pdVar5) {
            pdVar19 = pdVar5;
          }
          uVar25 = (long)pdVar19 + (-9 - (long)pdVar4);
          uVar26 = (uint)(uVar25 >> 0x20);
          auVar48 = ZEXT816(0x8000000000000000) << 0x40;
          uVar22 = 0;
          do {
            dVar33 = auVar48._0_8_;
            dVar50 = auVar48._8_8_;
            auVar41._8_4_ = (int)uVar22;
            auVar41._0_8_ = uVar22;
            auVar41._12_4_ = (int)(uVar22 >> 0x20);
            auVar8._4_4_ = uVar26 >> 3;
            auVar8._0_4_ = (int)(uVar25 >> 3);
            auVar8._8_4_ = (int)(uVar25 >> 3);
            auVar8._12_4_ = uVar26 >> 3;
            auVar49 = auVar8 ^ auVar53;
            auVar34 = (auVar41 | auVar52) ^ auVar53;
            auVar47._0_4_ = -(uint)(auVar49._0_4_ < auVar34._0_4_);
            auVar47._4_4_ = -(uint)(auVar49._4_4_ < auVar34._4_4_);
            auVar47._8_4_ = -(uint)(auVar49._8_4_ < auVar34._8_4_);
            auVar47._12_4_ = -(uint)(auVar49._12_4_ < auVar34._12_4_);
            auVar42._4_4_ = -(uint)(auVar34._4_4_ == auVar49._4_4_);
            auVar42._12_4_ = -(uint)(auVar34._12_4_ == auVar49._12_4_);
            auVar42._0_4_ = auVar42._4_4_;
            auVar42._8_4_ = auVar42._12_4_;
            auVar51._4_4_ = auVar47._4_4_;
            auVar51._0_4_ = auVar47._4_4_;
            auVar51._8_4_ = auVar47._12_4_;
            auVar51._12_4_ = auVar47._12_4_;
            auVar51 = auVar42 & auVar47 | auVar51;
            if ((~auVar51._0_4_ & 1) != 0) {
              auVar49._8_8_ = 0;
              auVar49._0_8_ = pdVar4[uVar22 + 1];
            }
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            in_XMM6 = auVar51 ^ auVar10;
            if ((in_XMM6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar49._8_8_ = pdVar4[uVar22 + 2];
            }
            auVar48._0_8_ = auVar49._0_8_ * auVar49._0_8_ + dVar33;
            auVar48._8_8_ = auVar49._8_8_ * auVar49._8_8_ + dVar50;
            uVar22 = uVar22 + 2;
          } while (((uVar25 >> 3) + 2 & 0xfffffffffffffffe) != uVar22);
          auVar9._4_4_ = auVar47._0_4_;
          auVar9._0_4_ = auVar47._0_4_;
          auVar9._8_4_ = auVar47._8_4_;
          auVar9._12_4_ = auVar47._8_4_;
          auVar43._4_4_ = auVar47._4_4_;
          auVar43._0_4_ = auVar47._4_4_;
          auVar43._8_4_ = auVar47._12_4_;
          auVar43._12_4_ = auVar47._12_4_;
          auVar43 = auVar42 & auVar9 | auVar43;
          uVar25 = auVar43._0_8_;
          auVar36._0_8_ = (ulong)dVar33 & uVar25;
          uVar22 = auVar43._8_8_;
          auVar36._8_8_ = (ulong)dVar50 & uVar22;
          auVar44._0_8_ = ~uVar25 & (ulong)auVar48._0_8_;
          auVar44._8_8_ = ~uVar22 & (ulong)auVar48._8_8_;
          local_78 = SUB168(auVar44 | auVar36,8) + SUB168(auVar44 | auVar36,0);
        }
        local_78 = *pdVar4 - local_78;
        if ((local_78 < 0.0) || (ABS(local_78) < 1e-12)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "TPZSkylMatrix::DecomposeCholesky a matrix nao e positiva definida",0x41);
          poVar20 = std::ostream::_M_insert<double>(local_78);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
          std::ostream::put((char)poVar20);
          std::ostream::flush();
          bVar13 = false;
          auVar52 = _DAT_014f8340;
          auVar53 = _DAT_014f8350;
        }
        else {
          if (local_78 < 0.0) {
            dVar33 = sqrt(local_78);
            auVar52 = _DAT_014f8340;
            auVar53 = _DAT_014f8350;
          }
          else {
            dVar33 = SQRT(local_78);
          }
          *pdVar4 = dVar33;
        }
      }
      local_90 = local_90 + -8;
      local_88 = local_88 + 1;
      local_80 = local_80 + 8;
    } while (bVar13);
    local_98 = local_98 + blk_sz * -8;
    local_a8 = local_a8 + blk_sz;
    lVar23 = lVar23 + blk_sz * 8;
    lVar16 = lVar17;
    if (lVar27 < lVar15) {
      return 0;
    }
  } while( true );
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_Cholesky_blk(int64_t blk_sz)
{
    if(this->fDecomposed == ECholesky) 
        return 1;
    if (this->fDecomposed )  
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_Cholesky <Matrix already Decomposed>" );
    
    TVar pivot = (TVar)0.;
    TVar minpivot = 10000.;
    int64_t dimension = this->Dim();
    
    for (int64_t blk_i = 0; blk_i < dimension; blk_i += blk_sz) {
        int64_t first_row = blk_i;
        int64_t first_col = blk_i;
        int64_t last_row  = blk_i + MIN(dimension,blk_i+blk_sz);
        
        // Compute band inner nodes
        for ( int64_t j = first_col; j < dimension; j++) {
            
            if (Size(j) == 0)   
                return( 0 ); // Size of column cannot be zero.
            
            int64_t first_i = MAX(first_row, (j+1)-Size(j));
            int64_t last_i = MIN(last_row, j); // j-1 becase we do not need to compute u(j,j)
            for ( int64_t i = first_i; i < last_i; i++) {
                
                // Compute u(i,j) = (a_ij - SUM_k_1_to_i-1 (u_ki * u_kj) ) / uii 
                
                //	TVar  u_ii = fElem[i][0];
                int64_t I = j-i; // fElem[j][I] = A(i,j) I = j-i
                TVar* u_ij = &fElem[j][I];
                
                TVar sum = 0.0;
                TVar *elem_kj = u_ij+1;
                TVar *end_kj  = fElem[j+1];
                TVar *elem_ki = &fElem[i][1];
                TVar *end_ki  = fElem[i+1];
                
                // Faz sum = SOMA( A(i,p) * A(k,p) ), p = 1,..,k-1.
                sum = 0.0;
                
                unsigned max_l = end_kj - elem_kj;
                unsigned tmp = end_ki - elem_ki;
                if (tmp < max_l) max_l = tmp;
#pragma clang loop vectorize_width(2)
                for(unsigned l=0; l<max_l; l++)
                    sum += (*elem_kj++) * (*elem_ki++);
                
                *u_ij = (*u_ij - sum) / pivot;
            } 
            
            // After computing all the elements of this column, compute the diagonal (ujj)
            if (last_i == j)
            {
                TVar sum = 0.0;
                TVar* u_jj = &fElem[j][0];
                TVar *elem_k = fElem[j]+1;
                TVar *end_k  = fElem[j+1];
#pragma clang loop vectorize_width(2)
                for ( ; elem_k < end_k; elem_k++ ) sum += (*elem_k) * (*elem_k);
                pivot = *u_jj - sum;
                
                minpivot = minpivot < pivot ? minpivot : pivot;
                
                if ( pivot < ((TVar)0.) || IsZero(pivot) ) {
                    cout << "TPZSkylMatrix::DecomposeCholesky a matrix nao e positiva definida" << pivot << endl;
                    return( 0 );
                }
                // Valor do elemento da diagonal k,k
                *u_jj = sqrt( pivot );
            }
        }
    }	
    this->fDecomposed  = ECholesky;
    this->fDefPositive = 1;
    return( 1 );
}